

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall gnilk::LogConsoleSink::~LogConsoleSink(LogConsoleSink *this)

{
  LogConsoleSink *this_local;
  
  ~LogConsoleSink(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~LogConsoleSink() = default;